

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtag.cpp
# Opt level: O2

string * __thiscall
Jtag::shiftData(string *__return_storage_ptr__,Jtag *this,uint bitCount,string *tdi)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  char cVar4;
  sbyte sVar5;
  Jtag *pJVar6;
  bool bVar7;
  uint i;
  uint uVar8;
  int iVar9;
  undefined2 *puVar10;
  byte *pbVar11;
  ostream *poVar12;
  int iVar13;
  ulong uVar14;
  byte *pbVar15;
  ulong uVar16;
  int iVar17;
  byte *pbVar18;
  DWORD dwNumBytesSent;
  DWORD dwNumBytesRead;
  DWORD dwNumBytesToRead;
  byte *local_240;
  string *local_238;
  byte *local_230;
  ulong local_228;
  int local_21c;
  ulong local_218;
  Jtag *local_210;
  ulong local_208;
  string *local_200;
  string local_1f8;
  string local_1d8 [32];
  stringstream ss;
  undefined1 local_1a8 [376];
  
  iVar17 = ((bitCount >> 3) + 1) - (uint)((bitCount & 7) == 0);
  local_210 = this;
  puVar10 = (undefined2 *)operator_new__((ulong)(iVar17 + 3));
  local_230 = (byte *)operator_new__((ulong)(iVar17 + 3));
  pbVar11 = (byte *)operator_new__((ulong)(iVar17 + 6));
  pJVar6 = local_210;
  dwNumBytesSent = 0;
  dwNumBytesToRead = 0;
  dwNumBytesRead = 0;
  local_200 = tdi;
  if ((tdi->_M_string_length < (ulong)(((bitCount >> 2) + 1) - (uint)((bitCount & 3) == 0))) ||
     (local_238 = __return_storage_ptr__, bVar7 = flush(local_210),
     __return_storage_ptr__ = local_238, !bVar7)) goto LAB_0010f9a7;
  local_240 = pbVar11;
  if (bitCount < 9) {
    uVar8 = std::__cxx11::stoi(local_200,(size_t *)0x0,0x10);
    *(undefined1 *)puVar10 = 0x3b;
    cVar4 = (char)bitCount;
    *(char *)((long)puVar10 + 1) = cVar4 + -2;
    *(char *)(puVar10 + 1) = (char)uVar8;
    iVar17 = FT_Write(pJVar6->ftHandle,puVar10,3,&dwNumBytesSent);
    if (iVar17 == 0) {
      *puVar10 = 0x6e;
      *(byte *)(puVar10 + 1) = (char)(uVar8 >> (cVar4 - 1U & 7)) << 7 | 3;
      iVar17 = FT_Write(pJVar6->ftHandle,puVar10,3,&dwNumBytesSent);
      pbVar18 = local_230;
      __return_storage_ptr__ = local_238;
      if (iVar17 == 0) {
        do {
          iVar17 = FT_GetQueueStatus(pJVar6->ftHandle,&dwNumBytesToRead);
          pbVar11 = local_240;
        } while (iVar17 == 0 && dwNumBytesToRead == 0);
        iVar17 = FT_Read(pJVar6->ftHandle,local_240,dwNumBytesToRead,&dwNumBytesRead);
        if (iVar17 == 0) {
          *pbVar18 = pbVar11[1] >> (8U - cVar4 & 0x1f) | *pbVar11 >> (9U - cVar4 & 0x1f);
          uVar14 = 1;
          goto LAB_0010fb3a;
        }
        operator_delete(puVar10,1);
        operator_delete(pbVar18,1);
      }
      else {
        operator_delete(puVar10,1);
        operator_delete(pbVar18,1);
        pbVar11 = local_240;
      }
      operator_delete(pbVar11,1);
      goto LAB_0010f9a7;
    }
    operator_delete(puVar10,1);
    operator_delete(local_230,1);
    pbVar11 = local_240;
  }
  else {
    local_218 = (ulong)bitCount;
    pbVar11 = (byte *)operator_new__((ulong)(iVar17 + 1));
    std::__cxx11::string::string((string *)&local_1f8,(string *)local_200);
    hexToByte(&local_1f8,pbVar11);
    std::__cxx11::string::~string((string *)&local_1f8);
    uVar8 = (int)local_218 - 1;
    local_208 = (ulong)uVar8;
    local_228 = (ulong)(uVar8 >> 3);
    if (0x80007 < uVar8) {
      poVar12 = std::operator<<((ostream *)&std::cout,"Large transfers with reads may not work!");
      std::endl<char,std::char_traits<char>>(poVar12);
    }
    iVar13 = 0;
    uVar14 = local_228 & 0xffffffff;
    while (pJVar6 = local_210, uVar8 = (uint)uVar14, uVar8 != 0) {
      uVar16 = 0x10000;
      if (uVar8 < 0x10000) {
        uVar16 = uVar14;
      }
      *(undefined1 *)puVar10 = 0x39;
      iVar3 = (int)uVar16;
      *(char *)((long)puVar10 + 1) = (char)(iVar3 + -1);
      *(char *)(puVar10 + 1) = (char)((uint)(iVar3 + -1) >> 8);
      for (uVar14 = 0; uVar16 != uVar14; uVar14 = uVar14 + 1) {
        *(byte *)((long)puVar10 + uVar14 + 3) = pbVar11[(uint)(iVar13 + (int)uVar14)];
      }
      iVar9 = FT_Write(local_210->ftHandle,puVar10,iVar3 + 3);
      if (iVar9 != 0) goto LAB_0010f960;
      iVar13 = iVar13 + iVar3;
      uVar14 = (ulong)(uVar8 - iVar3);
    }
    uVar8 = (uint)local_208 & 7;
    local_21c = ((uint)local_208 & 0xfffffff8) + 1;
    sVar5 = (sbyte)uVar8;
    if (local_21c == (int)local_218) {
      uVar14 = (ulong)(iVar17 - 1);
      iVar17 = (int)local_228;
LAB_0010f92d:
      bVar1 = pbVar11[uVar14];
      *puVar10 = 0x6e;
      *(byte *)(puVar10 + 1) = (bVar1 >> sVar5) << 7 | 3;
      iVar13 = FT_Write(pJVar6->ftHandle,puVar10,3,&dwNumBytesSent);
      if (iVar13 != 0) goto LAB_0010f960;
      bVar7 = local_21c == (int)local_218;
      local_208 = (ulong)uVar8;
      do {
        iVar13 = FT_GetQueueStatus(pJVar6->ftHandle,&dwNumBytesToRead);
        pbVar15 = local_240;
        if (dwNumBytesToRead == (iVar17 - (uint)bVar7) + 2) break;
      } while (iVar13 == 0);
      iVar17 = FT_Read(pJVar6->ftHandle,local_240,dwNumBytesToRead,&dwNumBytesRead);
      pbVar18 = local_230;
      __return_storage_ptr__ = local_238;
      if (iVar17 == 0) {
        for (uVar14 = 0; local_228 != uVar14; uVar14 = uVar14 + 1) {
          local_230[uVar14] = pbVar15[uVar14];
        }
        if (local_21c == (int)local_218) {
          local_230[local_228] = pbVar15[dwNumBytesRead - 1] >> 7;
        }
        else {
          local_230[local_228] =
               pbVar15[dwNumBytesRead - 1] >> (((byte)local_208 ^ 7) & 0x1f) |
               pbVar15[local_228] >> (8 - (byte)local_208 & 0x1f);
        }
        uVar14 = (ulong)((int)local_228 + 1);
        operator_delete(pbVar11,1);
LAB_0010fb3a:
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        for (; 0 < (long)uVar14; uVar14 = uVar14 - 1) {
          poVar12 = std::operator<<(local_1a8,0x30);
          lVar2 = *(long *)poVar12;
          *(undefined8 *)(poVar12 + *(long *)(lVar2 + -0x18) + 0x10) = 2;
          lVar2 = *(long *)(lVar2 + -0x18);
          *(uint *)(poVar12 + lVar2 + 0x18) = *(uint *)(poVar12 + lVar2 + 0x18) & 0xffffffb5 | 8;
          std::ostream::operator<<(poVar12,(uint)pbVar18[uVar14 - 1]);
        }
        std::__cxx11::stringbuf::str();
        if (__return_storage_ptr__->_M_string_length - 1 == local_200->_M_string_length) {
          std::__cxx11::string::substr((ulong)local_1d8,(ulong)__return_storage_ptr__);
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_1d8);
          std::__cxx11::string::~string(local_1d8);
        }
        operator_delete(puVar10,1);
        operator_delete(pbVar18,1);
        operator_delete(local_240,1);
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        return __return_storage_ptr__;
      }
      operator_delete(puVar10,1);
      operator_delete(local_230,1);
    }
    else {
      *(undefined1 *)puVar10 = 0x3b;
      *(sbyte *)((long)puVar10 + 1) = sVar5 + -1;
      uVar14 = (ulong)(iVar17 - 1);
      *(byte *)(puVar10 + 1) = pbVar11[uVar14];
      iVar13 = FT_Write(local_210->ftHandle,puVar10,3,&dwNumBytesSent);
      iVar17 = (int)local_228;
      if (iVar13 == 0) goto LAB_0010f92d;
LAB_0010f960:
      operator_delete(puVar10,1);
      operator_delete(local_230,1);
      pbVar15 = local_240;
    }
    operator_delete(pbVar15,1);
  }
  operator_delete(pbVar11,1);
  __return_storage_ptr__ = local_238;
LAB_0010f9a7:
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&ss);
  return __return_storage_ptr__;
}

Assistant:

string Jtag::shiftData(unsigned int bitCount, string tdi) {
	FT_STATUS ftStatus;
	unsigned int reqBytes = bitCount / 8 + (bitCount % 8 > 0);
	BYTE *byOutputBuffer = new BYTE[reqBytes + 3];
	BYTE *tdoBuffer = new BYTE[reqBytes + 3];
	BYTE *byInputBuffer = new BYTE[reqBytes + 6];
	DWORD dwNumBytesSent = 0;
	DWORD dwNumBytesToRead = 0;
	DWORD dwNumBytesRead = 0;
	DWORD tdoBytes = 0;

	unsigned int reqHex = bitCount / 4 + (bitCount % 4 > 0);

	if (tdi.length() < reqHex)
		return "";

	if (!flush())
		return "";

	if (bitCount < 9) {
		int data = stoi(tdi, 0, 16);
		byOutputBuffer[0] = 0x3B;
		byOutputBuffer[1] = bitCount - 2;
		byOutputBuffer[2] = data & 0xff;
		ftStatus = FT_Write(ftHandle, byOutputBuffer, 3, &dwNumBytesSent);
		if (ftStatus != FT_OK) {
			delete byOutputBuffer;
			delete tdoBuffer;
			delete byInputBuffer;
			return "";
		}

		BYTE lastBit = (data >> ((bitCount - 1) % 8)) & 0x01;

		byOutputBuffer[0] = 0x6E;
		byOutputBuffer[1] = 0x00;
		byOutputBuffer[2] = 0x03 | (lastBit << 7);
		ftStatus = FT_Write(ftHandle, byOutputBuffer, 3, &dwNumBytesSent);
		if (ftStatus != FT_OK) {
			delete byOutputBuffer;
			delete tdoBuffer;
			delete byInputBuffer;
			return "";
		}

		do {
			ftStatus = FT_GetQueueStatus(ftHandle, &dwNumBytesToRead);
			// Get the number of bytes in the device input buffer
		} while ((dwNumBytesToRead == 0) && (ftStatus == FT_OK));
		//or Timeout
		ftStatus = FT_Read(ftHandle, byInputBuffer, dwNumBytesToRead,
				&dwNumBytesRead);
		if (ftStatus != FT_OK) {
			delete byOutputBuffer;
			delete tdoBuffer;
			delete byInputBuffer;
			return "";
		}

		tdoBuffer[0] = byInputBuffer[0] >> (8 - (bitCount - 1));
		tdoBuffer[0] |= byInputBuffer[1] >> (7 - (bitCount - 1));
		tdoBytes = 1;

	} else {
		BYTE *tdiBytes = new BYTE[reqBytes + 1];
		hexToByte(tdi, tdiBytes);

		unsigned int fullBytes = (bitCount - 1) / 8;
		unsigned int remBytes = fullBytes;
		unsigned int offset = 0;

		if (fullBytes > 65536) {
			cout << "Large transfers with reads may not work!" << endl;
		}

		while (remBytes > 0) {
			unsigned int bct = remBytes > 65536 ? 65536 : remBytes;
			byOutputBuffer[0] = 0x39;
			byOutputBuffer[1] = (bct - 1) & 0xff;
			byOutputBuffer[2] = ((bct - 1) >> 8) & 0xff;

			for (unsigned int i = 0; i < bct; i++) {
				byOutputBuffer[3 + i] = tdiBytes[i + offset];
			}

			ftStatus = FT_Write(ftHandle, byOutputBuffer, 3 + bct,
					&dwNumBytesSent);
			if (ftStatus != FT_OK) {
				delete byOutputBuffer;
				delete tdoBuffer;
				delete byInputBuffer;
				delete tdiBytes;
				return "";
			}

			remBytes -= bct;
			offset += bct;
		}

		unsigned int partialBits = bitCount - 1 - (fullBytes * 8);

		if (fullBytes * 8 + 1 != bitCount) {
			byOutputBuffer[0] = 0x3B;
			byOutputBuffer[1] = partialBits - 1;
			byOutputBuffer[2] = tdiBytes[reqBytes - 1] & 0xff;
			ftStatus = FT_Write(ftHandle, byOutputBuffer, 3, &dwNumBytesSent);
			if (ftStatus != FT_OK) {
				delete byOutputBuffer;
				delete tdoBuffer;
				delete byInputBuffer;
				delete tdiBytes;
				return "";
			}
		}

		BYTE lastBit = (tdiBytes[reqBytes - 1] >> ((bitCount - 1) % 8)) & 0x01;

		byOutputBuffer[0] = 0x6E;
		byOutputBuffer[1] = 0x00;
		byOutputBuffer[2] = 0x03 | (lastBit << 7);
		ftStatus = FT_Write(ftHandle, byOutputBuffer, 3, &dwNumBytesSent);
		if (ftStatus != FT_OK) {
			delete byOutputBuffer;
			delete tdoBuffer;
			delete byInputBuffer;
			delete tdiBytes;
			return "";
		}

		DWORD bytesToRead = fullBytes
				+ ((fullBytes * 8 + 1 != bitCount) ? 2 : 1);
		do {
			ftStatus = FT_GetQueueStatus(ftHandle, &dwNumBytesToRead);
			// Get the number of bytes in the device input buffer
		} while ((dwNumBytesToRead != bytesToRead) && (ftStatus == FT_OK));
		//or Timeout
		ftStatus = FT_Read(ftHandle, byInputBuffer, dwNumBytesToRead,
				&dwNumBytesRead);
		if (ftStatus != FT_OK) {
			delete byOutputBuffer;
			delete tdoBuffer;
			delete byInputBuffer;
			delete tdiBytes;
			return "";
		}

		for (unsigned int i = 0; i < fullBytes; i++)
			tdoBuffer[tdoBytes++] = byInputBuffer[i];

		if (fullBytes * 8 + 1 != bitCount) {
			tdoBuffer[tdoBytes] = byInputBuffer[tdoBytes] >> (8 - partialBits);
			tdoBuffer[tdoBytes++] |= byInputBuffer[dwNumBytesRead - 1]
					>> (7 - partialBits);
		} else {
			tdoBuffer[tdoBytes++] = byInputBuffer[dwNumBytesRead - 1] >> 7;
		}

		delete tdiBytes;
	}

	//Read out the data from input buffer
	std::stringstream ss;
	for (int i = tdoBytes - 1; i >= 0; i--)
		ss << setfill('0') << setw(2) << hex << (int) tdoBuffer[i];
	string hexTdo = ss.str();
	if (hexTdo.length() - 1 == tdi.length())
		hexTdo = hexTdo.substr(1, hexTdo.length() - 1);

	delete byOutputBuffer;
	delete tdoBuffer;
	delete byInputBuffer;
	return hexTdo;
}